

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TwoStageDynamicBayesianNetwork.cpp
# Opt level: O0

void __thiscall
TwoStageDynamicBayesianNetwork::TwoStageDynamicBayesianNetwork
          (TwoStageDynamicBayesianNetwork *this,
          MultiAgentDecisionProcessDiscreteFactoredStatesInterface *madp)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = in_RSI;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  std::vector<Scope,_std::allocator<Scope>_>::vector
            ((vector<Scope,_std::allocator<Scope>_> *)0xaf12c8);
  std::vector<Scope,_std::allocator<Scope>_>::vector
            ((vector<Scope,_std::allocator<Scope>_> *)0xaf12d5);
  std::vector<Scope,_std::allocator<Scope>_>::vector
            ((vector<Scope,_std::allocator<Scope>_> *)0xaf12e2);
  std::vector<Scope,_std::allocator<Scope>_>::vector
            ((vector<Scope,_std::allocator<Scope>_> *)0xaf12ef);
  std::vector<Scope,_std::allocator<Scope>_>::vector
            ((vector<Scope,_std::allocator<Scope>_> *)0xaf12ff);
  std::vector<Scope,_std::allocator<Scope>_>::vector
            ((vector<Scope,_std::allocator<Scope>_> *)0xaf130f);
  std::vector<Scope,_std::allocator<Scope>_>::vector
            ((vector<Scope,_std::allocator<Scope>_> *)0xaf131f);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)0xaf132f);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)0xaf133f);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)0xaf134f);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)0xaf135f);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xaf136f);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xaf137f);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xaf138f);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xaf139f);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)0xaf13af);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)0xaf13bf);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)0xaf13cf);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)0xaf13df);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)0xaf13ef);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xaf13ff);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xaf140f);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xaf141f);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xaf142f);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xaf143f);
  std::vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>::vector
            ((vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_> *)0xaf144f);
  std::vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>::vector
            ((vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_> *)0xaf145f);
  std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::vector
            ((vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> *)0xaf146f);
  std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::vector
            ((vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> *)0xaf147f);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
            *)0xaf148f);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
            *)0xaf149f);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
            *)0xaf14af);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
            *)0xaf14bf);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
            *)0xaf14cf);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
            *)0xaf14df);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
            *)0xaf14ef);
  *(undefined1 *)(in_RDI + 3) = 0;
  in_RDI[0x56] = 0;
  in_RDI[0x5a] = 0;
  in_RDI[0x5e] = 0;
  in_RDI[0x68] = 0;
  in_RDI[0x75] = 0;
  return;
}

Assistant:

TwoStageDynamicBayesianNetwork::TwoStageDynamicBayesianNetwork(
                MultiAgentDecisionProcessDiscreteFactoredStatesInterface& madp)
            :
                _m_madp(&madp)
                ,_m_nrY(0)
                ,_m_nrO(0)
{
    _m_SoIStorageInitialized = false;
    _m_IndividualToJointYiiIndices_catVector = 0;
    _m_IndividualToJointOiiIndices_catVector = 0;
    _m_SampleY = 0;
    _m_SampleO = 0;
    _m_SampleNrO = 0;

}